

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall DPlayerMenu::Responder(DPlayerMenu *this,event_t *ev)

{
  FName local_2c;
  FListMenuItem *local_28;
  FListMenuItem *li;
  event_t *ev_local;
  DPlayerMenu *this_local;
  
  li = (FListMenuItem *)ev;
  ev_local = (event_t *)this;
  if (((ev->type == '\x04') && (ev->subtype == '\x04')) && (ev->data1 == 0x20)) {
    this->mRotation = 8 - this->mRotation;
    FName::FName(&local_2c,NAME_Playerdisplay);
    local_28 = DListMenu::GetItem(&this->super_DListMenu,&local_2c);
    if (local_28 != (FListMenuItem *)0x0) {
      (*local_28->_vptr_FListMenuItem[10])(local_28,0x10001,(ulong)(uint)this->mRotation);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = DListMenu::Responder(&this->super_DListMenu,ev);
  }
  return this_local._7_1_;
}

Assistant:

bool DPlayerMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_Char && ev->data1 == ' ')
	{
		// turn the player sprite around
		mRotation = 8 - mRotation;
		FListMenuItem *li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_ROTATION, mRotation);
		}
		return true;
	}
	return Super::Responder(ev);
}